

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O3

void Acec_ManProfile(Gia_Man_t *p,int fVerbose)

{
  void *__ptr;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  timespec ts;
  Vec_Int_t *vXors;
  timespec local_60;
  Vec_Int_t *local_50;
  Vec_Wec_t *local_48;
  int local_3c;
  Vec_Int_t *local_38;
  
  iVar1 = clock_gettime(3,&local_60);
  if (iVar1 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  local_3c = fVerbose;
  pVVar7 = Ree_ManComputeCuts(p,&local_38,fVerbose);
  uVar2 = Ree_ManCountFadds(pVVar7);
  iVar1 = pVVar7->nSize;
  local_50 = pVVar7;
  iVar3 = Ree_ManCountFadds(pVVar7);
  iVar4 = local_38->nSize;
  iVar8 = iVar4 + 3;
  if (-1 < iVar4) {
    iVar8 = iVar4;
  }
  printf("Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ",(ulong)uVar2,
         (ulong)(uint)(iVar1 / 6 - iVar3),(ulong)(uint)(iVar8 >> 2));
  iVar4 = 3;
  iVar1 = clock_gettime(3,&local_60);
  if (iVar1 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  Abc_Print(iVar4,"%s =","Time");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar13 + lVar9) / 1000000.0);
  iVar4 = clock_gettime(3,&local_60);
  iVar1 = local_3c;
  if (iVar4 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  local_48 = Acec_ManCollectBoxSets(p,local_50,local_38);
  uVar2 = local_48->nSize;
  pcVar10 = "";
  if (9 < (int)uVar2) {
    pcVar10 = "s";
  }
  printf("Detected %d adder-tree%s.  ",(ulong)(uint)((int)uVar2 / 5),pcVar10);
  iVar8 = 3;
  iVar4 = clock_gettime(3,&local_60);
  if (iVar4 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  Abc_Print(iVar8,"%s =","Time");
  Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar13 + lVar9) / 1000000.0);
  if ((iVar1 != 0) && (0 < (int)uVar2)) {
    uVar12 = 0;
    uVar11 = 0;
    do {
      printf("Tree %3d : ",(ulong)uVar11);
      pVVar7 = local_48->pArray;
      iVar1 = (int)uVar12;
      printf("Xor = %4d  ",(ulong)(uint)pVVar7[uVar12].nSize);
      if ((int)uVar2 <= (int)(iVar1 + 1U)) {
LAB_00671878:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      printf("Root = %4d  ",(ulong)(uint)pVVar7[iVar1 + 1U].nSize);
      if (uVar2 <= iVar1 + 2U) goto LAB_00671878;
      printf("Adder = %4d  ",(ulong)(uint)pVVar7[iVar1 + 2U].nSize);
      uVar5 = iVar1 + 3;
      if (uVar2 <= uVar5) goto LAB_00671878;
      printf("In = %4d  ",(ulong)(uint)(pVVar7[uVar5].nSize / 2));
      uVar6 = iVar1 + 4;
      if (uVar2 <= uVar6) goto LAB_00671878;
      printf("Out = %4d  ",(ulong)(uint)(pVVar7[uVar6].nSize / 2));
      putchar(10);
      printf("           Ins:  ");
      Acec_ManPrintRanks(pVVar7 + uVar5);
      printf("           Outs: ");
      Acec_ManPrintRanks(pVVar7 + uVar6);
      uVar11 = uVar11 + 1;
      uVar12 = (ulong)(iVar1 + 5U);
    } while ((int)(iVar1 + 5U) < (int)uVar2);
  }
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
  }
  free(local_38);
  if (local_50->pArray != (int *)0x0) {
    free(local_50->pArray);
  }
  free(local_50);
  iVar1 = local_48->nCap;
  pVVar7 = local_48->pArray;
  if ((long)iVar1 < 1) {
    if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_0067185f;
  }
  else {
    lVar9 = 0;
    do {
      __ptr = *(void **)((long)&pVVar7->pArray + lVar9);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar7->pArray + lVar9) = 0;
      }
      lVar9 = lVar9 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar9);
  }
  free(pVVar7);
LAB_0067185f:
  free(local_48);
  return;
}

Assistant:

void Acec_ManProfile( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Vec_Wec_t * vBoxes; int i;
    Vec_Int_t * vXors, * vAdds = Ree_ManComputeCuts( p, &vXors, fVerbose );

    //Ree_ManPrintAdders( vAdds, 1 );
    printf( "Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ", Ree_ManCountFadds(vAdds), Vec_IntSize(vAdds)/6-Ree_ManCountFadds(vAdds), Vec_IntSize(vXors)/4 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vBoxes = Acec_ManCollectBoxSets( p, vAdds, vXors );
    printf( "Detected %d adder-tree%s.  ", Vec_WecSize(vBoxes)/5, Vec_WecSize(vBoxes)/5 > 1 ? "s":"" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( fVerbose )
    for ( i = 0; 5*i < Vec_WecSize(vBoxes); i++ )
    {
        printf( "Tree %3d : ",     i );
        printf( "Xor = %4d  ",     Vec_IntSize(Vec_WecEntry(vBoxes,5*i+0)) );
        printf( "Root = %4d  ",    Vec_IntSize(Vec_WecEntry(vBoxes,5*i+1)) );
        //printf( "(Top = %5d)  ",   Vec_IntEntryLast(Vec_WecEntry(vBoxes,5*i+1)) );
        printf( "Adder = %4d  ",   Vec_IntSize(Vec_WecEntry(vBoxes,5*i+2)) );
        printf( "In = %4d  ",      Vec_IntSize(Vec_WecEntry(vBoxes,5*i+3))/2 );
        printf( "Out = %4d  ",     Vec_IntSize(Vec_WecEntry(vBoxes,5*i+4))/2 );
        printf( "\n" );
        printf( "           Ins:  " );
        Acec_ManPrintRanks( Vec_WecEntry(vBoxes,5*i+3) );
        printf( "           Outs: " );
        Acec_ManPrintRanks( Vec_WecEntry(vBoxes,5*i+4) );
    }

    Vec_IntFree( vXors );
    Vec_IntFree( vAdds );
    Vec_WecFree( vBoxes );
}